

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O3

int file_to_archive(cpio *cpio,char *srcpath)

{
  byte *pbVar1;
  char cVar2;
  size_t sVar3;
  byte *pbVar4;
  byte bVar5;
  int iVar6;
  int extraout_EAX;
  mode_t extraout_EAX_00;
  mode_t mVar7;
  mode_t extraout_EAX_01;
  mode_t extraout_EAX_02;
  mode_t extraout_EAX_03;
  int extraout_EAX_04;
  archive_entry *entry_00;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  char *__dest;
  ulong uVar11;
  byte *__src;
  archive_entry *spare;
  archive_entry *entry;
  archive_entry *local_40;
  archive_entry *local_38;
  
  entry_00 = archive_entry_new();
  local_38 = entry_00;
  if (entry_00 == (archive_entry *)0x0) {
    pcVar8 = "Couldn\'t allocate entry";
    iVar6 = 0;
LAB_0010b34b:
    lafe_errc(1,iVar6,pcVar8);
  }
  archive_entry_copy_sourcepath(entry_00,srcpath);
  iVar6 = archive_read_disk_entry_from_file(cpio->archive_read_disk,entry_00,-1,(stat *)0x0);
  if (iVar6 < -0x19) {
    pcVar8 = archive_error_string(cpio->archive_read_disk);
    lafe_errc(1,0,"%s",pcVar8);
  }
  if (iVar6 < 0) {
    pcVar8 = archive_error_string(cpio->archive_read_disk);
    lafe_warnc(0,"%s",pcVar8);
    if (iVar6 == -0x19) {
      archive_entry_free(entry_00);
      cpio->return_value = 1;
      return extraout_EAX;
    }
  }
  if (-1 < (long)cpio->uid_override) {
    archive_entry_set_uid(entry_00,(long)cpio->uid_override);
  }
  if (cpio->gname_override != (char *)0x0) {
    archive_entry_set_uname(entry_00,cpio->uname_override);
  }
  if (-1 < (long)cpio->gid_override) {
    archive_entry_set_gid(entry_00,(long)cpio->gid_override);
  }
  if (cpio->gname_override != (char *)0x0) {
    archive_entry_set_gname(entry_00,cpio->gname_override);
  }
  pcVar8 = cpio->destdir;
  if (pcVar8 != (char *)0x0) {
    sVar3 = cpio->destdir_len;
    sVar9 = strlen(srcpath);
    uVar11 = sVar9 + sVar3 + 8;
    uVar10 = cpio->pass_destpath_alloc;
    if (uVar11 < uVar10) {
      __dest = cpio->pass_destpath;
    }
    else {
      do {
        uVar10 = uVar10 * 2 + 0x400;
      } while (uVar10 <= uVar11);
      cpio->pass_destpath_alloc = uVar10;
      free(cpio->pass_destpath);
      __dest = (char *)malloc(cpio->pass_destpath_alloc);
      cpio->pass_destpath = __dest;
      if (__dest == (char *)0x0) {
        pcVar8 = "Can\'t allocate path buffer";
        iVar6 = 0xc;
        goto LAB_0010b34b;
      }
      pcVar8 = cpio->destdir;
    }
    strcpy(__dest,pcVar8);
    if ((((*srcpath == '\\') || (*srcpath == '/')) && ((srcpath[1] == '\\' || (srcpath[1] == '/'))))
       && (((cVar2 = srcpath[2], cVar2 == '?' || (cVar2 == '.')) &&
           ((srcpath[3] == '\\' || (srcpath[3] == '/')))))) {
      if (((((cVar2 == '?') && ((byte)(srcpath[4] | 0x20U) == 0x75)) &&
           ((byte)(srcpath[5] | 0x20U) == 0x6e)) && ((byte)(srcpath[6] | 0x20U) == 99)) &&
         ((srcpath[7] == '\\' || (srcpath[7] == '/')))) {
        srcpath = srcpath + 8;
      }
      else {
        srcpath = srcpath + 4;
      }
    }
    bVar5 = *srcpath;
    do {
      __src = (byte *)srcpath;
      pbVar4 = __src;
      if ((byte)((bVar5 & 0xdf) + 0xbf) < 0x1a) {
        pbVar4 = __src + (ulong)(__src[1] == 0x3a) * 2;
      }
      while ((srcpath = (char *)pbVar4, bVar5 = *srcpath, bVar5 == 0x5c || (bVar5 == 0x2f))) {
        pbVar1 = (byte *)srcpath + 1;
        pbVar4 = pbVar1;
        if ((((byte *)srcpath)[1] == 0x2e) && (((byte *)srcpath)[2] == 0x2e)) {
          pbVar4 = (byte *)srcpath + 3;
          if ((((byte *)srcpath)[3] != 0x2f) && (((byte *)srcpath)[3] != 0x5c)) {
            pbVar4 = pbVar1;
          }
        }
      }
    } while (__src != (byte *)srcpath);
    strcat(cpio->pass_destpath,(char *)__src);
    srcpath = cpio->pass_destpath;
  }
  if (cpio->option_rename != 0) {
    srcpath = cpio_rename(srcpath);
  }
  if (srcpath != (char *)0x0) {
    archive_entry_copy_pathname(entry_00,srcpath);
    local_40 = (archive_entry *)0x0;
    mVar7 = extraout_EAX_00;
    if ((cpio->linkresolver != (archive_entry_linkresolver *)0x0) &&
       (mVar7 = archive_entry_filetype(entry_00), mVar7 != 0x4000)) {
      archive_entry_linkify(cpio->linkresolver,&local_38,&local_40);
      entry_00 = local_38;
      mVar7 = extraout_EAX_01;
    }
    if (entry_00 != (archive_entry *)0x0) {
      entry_to_archive(cpio,entry_00);
      archive_entry_free(local_38);
      mVar7 = extraout_EAX_02;
      if (local_40 != (archive_entry *)0x0) {
        entry_to_archive(cpio,local_40);
        archive_entry_free(local_40);
        mVar7 = extraout_EAX_03;
      }
    }
    return mVar7;
  }
  archive_entry_free(entry_00);
  return extraout_EAX_04;
}

Assistant:

static int
file_to_archive(struct cpio *cpio, const char *srcpath)
{
	const char *destpath;
	struct archive_entry *entry, *spare;
	size_t len;
	int r;

	/*
	 * Create an archive_entry describing the source file.
	 *
	 */
	entry = archive_entry_new();
	if (entry == NULL)
		lafe_errc(1, 0, "Couldn't allocate entry");
	archive_entry_copy_sourcepath(entry, srcpath);
	r = archive_read_disk_entry_from_file(cpio->archive_read_disk,
	    entry, -1, NULL);
	if (r < ARCHIVE_FAILED)
		lafe_errc(1, 0, "%s",
		    archive_error_string(cpio->archive_read_disk));
	if (r < ARCHIVE_OK)
		lafe_warnc(0, "%s",
		    archive_error_string(cpio->archive_read_disk));
	if (r <= ARCHIVE_FAILED) {
		archive_entry_free(entry);
		cpio->return_value = 1;
		return (r);
	}

	if (cpio->uid_override >= 0)
		archive_entry_set_uid(entry, cpio->uid_override);
	if (cpio->gname_override != NULL)
		archive_entry_set_uname(entry, cpio->uname_override);
	if (cpio->gid_override >= 0)
		archive_entry_set_gid(entry, cpio->gid_override);
	if (cpio->gname_override != NULL)
		archive_entry_set_gname(entry, cpio->gname_override);

	/*
	 * Generate a destination path for this entry.
	 * "destination path" is the name to which it will be copied in
	 * pass mode or the name that will go into the archive in
	 * output mode.
	 */
	destpath = srcpath;
	if (cpio->destdir) {
		len = cpio->destdir_len + strlen(srcpath) + 8;
		if (len >= cpio->pass_destpath_alloc) {
			while (len >= cpio->pass_destpath_alloc) {
				cpio->pass_destpath_alloc += 512;
				cpio->pass_destpath_alloc *= 2;
			}
			free(cpio->pass_destpath);
			cpio->pass_destpath = malloc(cpio->pass_destpath_alloc);
			if (cpio->pass_destpath == NULL)
				lafe_errc(1, ENOMEM,
				    "Can't allocate path buffer");
		}
		strcpy(cpio->pass_destpath, cpio->destdir);
		strcat(cpio->pass_destpath, remove_leading_slash(srcpath));
		destpath = cpio->pass_destpath;
	}
	if (cpio->option_rename)
		destpath = cpio_rename(destpath);
	if (destpath == NULL) {
		archive_entry_free(entry);
		return (0);
	}
	archive_entry_copy_pathname(entry, destpath);

	/*
	 * If we're trying to preserve hardlinks, match them here.
	 */
	spare = NULL;
	if (cpio->linkresolver != NULL
	    && archive_entry_filetype(entry) != AE_IFDIR) {
		archive_entry_linkify(cpio->linkresolver, &entry, &spare);
	}

	if (entry != NULL) {
		r = entry_to_archive(cpio, entry);
		archive_entry_free(entry);
		if (spare != NULL) {
			if (r == 0)
				r = entry_to_archive(cpio, spare);
			archive_entry_free(spare);
		}
	}
	return (r);
}